

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

bool __thiscall Matrix::bShapeEqual(Matrix *this,Matrix *m)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  
  if (this->nMatrixDimension == m->nMatrixDimension) {
    if (this->nMatrixDimension < 1) {
      bVar1 = true;
    }
    else {
      bVar1 = true;
      lVar3 = 0;
      do {
        if (this->pSize[lVar3] != m->pSize[lVar3]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"error: size mismatch at dimension ",0x22);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," in matrix operation ",0x15);
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          bVar1 = false;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->nMatrixDimension);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error: dimensionality mismatch in matrix operation ",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matrix::bShapeEqual( const Matrix &m )
{
	bool ok = true;
	// check shape
	if( nMatrixDimension != m.nMatrixDimension ) {
		cout << "error: dimensionality mismatch in matrix operation " << endl;
		ok = false;
	} else {
		for(int i=0; i<nMatrixDimension; i++)
			if( pSize[i] != m.pSize[i] ) {
				cout << "error: size mismatch at dimension " << i << " in matrix operation " << endl;
				ok = false;
			}
	}
	return ok;
}